

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_check_mandatory_subtree
              (lyd_node *tree,lyd_node *subtree,lyd_node *last_parent,lys_node *schema,int toplevel,
              int options)

{
  LYS_NODE LVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ly_set *set;
  lys_node *plVar5;
  lys_node *node;
  lys_node *plVar6;
  lyd_node *last_parent_00;
  lyd_node *plVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xcf,
                  "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                 );
  }
  if ((schema->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) == LYS_UNKNOWN
     ) {
    set = (ly_set *)0x0;
  }
  else {
    set = (ly_set *)calloc(1,0x10);
    if (set == (ly_set *)0x0) {
      iVar3 = 1;
      set = (ly_set *)0x0;
      goto LAB_0015c347;
    }
    if ((tree != (lyd_node *)0x0 && toplevel != 0) || (subtree != (lyd_node *)0x0 && toplevel == 0))
    {
      plVar7 = tree;
      if (toplevel == 0) {
        plVar7 = subtree->child;
      }
      lyd_get_node_siblings(plVar7,schema,set);
    }
  }
  LVar1 = schema->nodetype;
  if (0x3f < (int)LVar1) {
    if ((int)LVar1 < 0x400) {
      if (((LVar1 == LYS_CASE) || (LVar1 == LYS_NOTIF)) || (LVar1 == LYS_INPUT)) {
LAB_0015c2de:
        for (plVar6 = schema->child; plVar6 != (lys_node *)0x0; plVar6 = plVar6->next) {
          iVar3 = lyd_check_mandatory_subtree(tree,subtree,last_parent,plVar6,toplevel,options);
          if (iVar3 != 0) goto LAB_0015c4e9;
        }
      }
    }
    else {
      if ((LVar1 == LYS_OUTPUT) || (LVar1 == LYS_USES)) goto LAB_0015c2de;
      if (LVar1 == LYS_ANYDATA) goto switchD_0015c229_caseD_4;
    }
    goto switchD_0015c229_caseD_3;
  }
  switch(LVar1) {
  case LYS_CONTAINER:
    if ((set->number != 0) ||
       (lVar2._0_2_ = schema[1].flags, lVar2._2_1_ = schema[1].ext_size,
       lVar2._3_1_ = schema[1].iffeature_size, lVar2._4_1_ = schema[1].padding[0],
       lVar2._5_1_ = schema[1].padding[1], lVar2._6_1_ = schema[1].padding[2],
       lVar2._7_1_ = schema[1].padding[3], lVar2 == 0)) {
      for (plVar6 = schema->child; plVar6 != (lys_node *)0x0; plVar6 = plVar6->next) {
        if (set->number == 0) {
          plVar7 = (lyd_node *)0x0;
          last_parent_00 = last_parent;
        }
        else {
          plVar7 = *(set->set).d;
          last_parent_00 = *(set->set).d;
        }
        iVar3 = lyd_check_mandatory_subtree(tree,plVar7,last_parent_00,plVar6,0,options);
        if (iVar3 != 0) {
          iVar3 = 1;
          goto LAB_0015c347;
        }
      }
    }
    break;
  case LYS_CHOICE:
    if ((tree == (lyd_node *)0x0 || toplevel == 0) && (subtree == (lyd_node *)0x0 || toplevel != 0))
    {
LAB_0015c46f:
      bVar10 = toplevel != 0;
      bVar9 = true;
      plVar6 = (lys_node *)tree;
    }
    else {
      plVar7 = tree;
      if (toplevel == 0) {
        plVar7 = subtree->child;
      }
      if (plVar7 == (lyd_node *)0x0) goto LAB_0015c46f;
      do {
        plVar5 = lys_parent(plVar7->schema);
        plVar6 = plVar7->schema;
        while (((node = plVar5, node != (lys_node *)0x0 && (node != schema)) &&
               ((node->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
          plVar5 = lys_parent(node);
          plVar6 = node;
        }
        bVar9 = node != schema;
      } while ((bVar9) && (plVar7 = plVar7->next, plVar7 != (lyd_node *)0x0));
      bVar10 = node != (lys_node *)0x0;
    }
    if (bVar9) {
      plVar6 = (lys_node *)schema[1].dsc;
      if (plVar6 == (lys_node *)0x0) {
        if ((schema->flags & 0x40) != 0) {
          ly_vlog(LYE_NOMANDCHOICE,LY_VLOG_LYD,last_parent,schema->name);
LAB_0015c4e9:
          iVar3 = 1;
          goto LAB_0015c347;
        }
        break;
      }
    }
    else if (!(bool)(bVar10 & plVar6 != (lys_node *)0x0)) {
      __assert_fail("siter && siter_prev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,300,
                    "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                   );
    }
    iVar4 = lyd_check_mandatory_subtree(tree,subtree,last_parent,plVar6,toplevel,options);
    goto LAB_0015c338;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    break;
  case LYS_LEAF:
  case LYS_LEAFLIST:
switchD_0015c229_caseD_4:
    iVar4 = lyd_check_mandatory_data(tree,last_parent,set,schema,options);
LAB_0015c338:
    iVar3 = 1;
    if (iVar4 != 0) goto LAB_0015c347;
    break;
  default:
    if (LVar1 == LYS_LIST) {
      iVar4 = lyd_check_mandatory_data(tree,last_parent,set,schema,options);
      iVar3 = 1;
      if (iVar4 != 0) goto LAB_0015c347;
      if (set->number != 0) {
        uVar8 = 0;
        do {
          for (plVar6 = schema->child; plVar6 != (lys_node *)0x0; plVar6 = plVar6->next) {
            iVar4 = lyd_check_mandatory_subtree
                              (tree,(lyd_node *)(set->set).s[uVar8],(lyd_node *)(set->set).s[uVar8],
                               plVar6,0,options);
            if (iVar4 != 0) goto LAB_0015c347;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < set->number);
      }
    }
    else if (LVar1 == LYS_ANYXML) goto switchD_0015c229_caseD_4;
  }
switchD_0015c229_caseD_3:
  iVar3 = 0;
LAB_0015c347:
  ly_set_free(set);
  return iVar3;
}

Assistant:

static int
lyd_check_mandatory_subtree(struct lyd_node *tree, struct lyd_node *subtree, struct lyd_node *last_parent,
                            struct lys_node *schema, int toplevel, int options)
{
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    struct ly_set *present = NULL;
    unsigned int u;
    int ret = EXIT_FAILURE;

    assert(schema);

    if (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_CONTAINER)) {
        /* data node */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((toplevel && tree) || (!toplevel && subtree)) {
            if (toplevel) {
                lyd_get_node_siblings(tree, schema, present);
            } else {
                lyd_get_node_siblings(subtree->child, schema, present);
            }
        }
    }

    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }
        break;
    case LYS_LIST:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }

        /* go recursively */
        for (u = 0; u < present->number; u++) {
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->set.d[u], present->set.d[u], siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;

    case LYS_CONTAINER:
        if (present->number || !((struct lys_node_container *)schema)->presence) {
            /* if we have existing or non-presence container, go recursively */
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->number ? present->set.d[0] : NULL,
                                                present->number ? present->set.d[0] : last_parent,
                                                siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data tree from the choice */
        iter = NULL;
        if ((toplevel && tree) || (!toplevel && subtree)) {
            LY_TREE_FOR(toplevel ? tree : subtree->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_check_mandatory_subtree(tree, subtree, last_parent, ((struct lys_node_choice *)schema)->dflt,
                                                toplevel, options)) {
                    goto error;
                }
            } else if (schema->flags & LYS_MAND_TRUE) {
                /* choice requires some data to be instantiated */
                LOGVAL(LYE_NOMANDCHOICE, LY_VLOG_LYD, last_parent, schema->name);
                goto error;
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter_prev, toplevel, options)) {
                goto error;
            }
        }
        break;
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* go recursively */
        LY_TREE_FOR(schema->child, siter) {
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter, toplevel, options)) {
                goto error;
            }
        }
        break;
    default:
        /* stop */
        break;
    }

    ret = EXIT_SUCCESS;

error:
    ly_set_free(present);
    return ret;
}